

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sb_multipass_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_55a5fa::AV1SBMultipassTest::~AV1SBMultipassTest(AV1SBMultipassTest *this)

{
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__AV1SBMultipassTest_01f57b78;
  in_RDI[2] = &PTR__AV1SBMultipassTest_01f57bd0;
  in_RDI[3] = &PTR__AV1SBMultipassTest_01f57bf0;
  if ((long *)in_RDI[0x80] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x80] + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x6144eb);
  libaom_test::CodecTestWith2Params<int,_bool>::~CodecTestWith2Params
            ((CodecTestWith2Params<int,_bool> *)0x6144f4);
  return;
}

Assistant:

~AV1SBMultipassTest() override { delete decoder_; }